

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting.cpp
# Opt level: O3

void scripting_interface::scripting_trace_log_parameter_printer
               (Scripting *scripting,ScriptingHandle replay,ScriptingHandle report_writer)

{
  SQInteger newtop;
  SQRESULT SVar1;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  
  newtop = sq_gettop(scripting->v);
  sq_pushroottable(scripting->v);
  sq_pushstring(scripting->v,"trace_log_parameter_printer",-1);
  SVar1 = sq_get(scripting->v,-2);
  if (SVar1 < 0) {
    printf("trace_log_parameter_printer not found in script!");
  }
  else {
    sq_pushroottable(scripting->v);
    obj._4_4_ = 0;
    obj._type = *replay;
    obj._unVal.pTable = ((SQObjectValue *)((long)replay + 8))->pTable;
    sq_pushobject(scripting->v,obj);
    obj_00._4_4_ = 0;
    obj_00._type = *report_writer;
    obj_00._unVal.pTable = ((SQObjectValue *)((long)report_writer + 8))->pTable;
    sq_pushobject(scripting->v,obj_00);
    sq_call(scripting->v,3,1,1);
    sq_pop(scripting->v,1);
  }
  sq_settop(scripting->v,newtop);
  return;
}

Assistant:

void scripting_trace_log_parameter_printer(Scripting *scripting, ScriptingHandle replay, ScriptingHandle report_writer) {
		HSQUIRRELVM &v = scripting->v;
		SQInteger top = sq_gettop(v);
		sq_pushroottable(v);
		sq_pushstring(v, _SC("trace_log_parameter_printer"), -1);
		bool success = SQ_SUCCEEDED(sq_get(v, -2));
		if (success) {
			sq_pushroottable(v);
			sq_pushobject(v, *(HSQOBJECT*)replay);
			sq_pushobject(v, *(HSQOBJECT*)report_writer);
			sq_call(v, 3, SQTrue, SQTrue);
			sq_pop(v, 1);
		}
		else {
			printf("trace_log_parameter_printer not found in script!");
		}
		sq_settop(v, top);
	}